

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O3

char * __thiscall
ON_ArchivableDictionaryPrivate::SetValue<signed_char>
          (ON_ArchivableDictionaryPrivate *this,wchar_t *key,char *value)

{
  char cVar1;
  _Base_ptr p_Var2;
  int iVar3;
  _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
  _Var4;
  _Base_ptr p_Var5;
  pair<std::_Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_bool>
  pVar6;
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>
  local_30;
  
  ON_wString::ON_wString(&local_30.first,key);
  local_30.second._M_t.super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>
  ._M_t.super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
  super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl =
       (__uniq_ptr_data<DictionaryEntry,_std::default_delete<DictionaryEntry>,_true,_true>)
       (__uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>)0x0;
  pVar6 = std::
          _Rb_tree<ON_wString,std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>,std::_Select1st<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
          ::
          _M_insert_unique<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>
                    ((_Rb_tree<ON_wString,std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>,std::_Select1st<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
                      *)&this->m_map,&local_30);
  _Var4 = pVar6.first._M_node;
  if ((_Head_base<0UL,_DictionaryEntry_*,_false>)
      local_30.second._M_t.
      super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>._M_t.
      super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
      super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl !=
      (_Head_base<0UL,_DictionaryEntry_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_30.second._M_t.
        super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>._M_t.
        super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
        super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl)[1])();
  }
  local_30.second._M_t.super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>
  ._M_t.super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
  super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl =
       (__uniq_ptr_data<DictionaryEntry,_std::default_delete<DictionaryEntry>,_true,_true>)
       (__uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>)0x0;
  ON_wString::~ON_wString(&local_30.first);
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    iVar3 = (**(code **)(*(long *)_Var4._M_node[1]._M_parent + 0x10))();
    if (iVar3 == 3) {
      p_Var5 = _Var4._M_node[1]._M_parent;
      *(char *)&p_Var5->_M_parent = *value;
      goto LAB_0038dc5c;
    }
  }
  cVar1 = *value;
  p_Var5 = (_Base_ptr)operator_new(0x10);
  *(char *)&p_Var5->_M_parent = cVar1;
  *(undefined ***)p_Var5 = &PTR__DictionaryEntry_00809778;
  p_Var2 = _Var4._M_node[1]._M_parent;
  _Var4._M_node[1]._M_parent = p_Var5;
  if (p_Var2 != (_Base_ptr)0x0) {
    (**(code **)(*(long *)p_Var2 + 8))();
    p_Var5 = _Var4._M_node[1]._M_parent;
  }
LAB_0038dc5c:
  return (char *)&p_Var5->_M_parent;
}

Assistant:

const T& SetValue(const wchar_t* key, const T& value)
  {
    auto r = m_map.insert({ key, nullptr });
    auto& entry_ptr = r.first->second;

    if (!r.second && entry_ptr->EntryType() == Entry<T>::Type)
    {
      return static_cast<Entry<T>*>(entry_ptr.get())->Value() = value;
    }
    else
    {
      entry_ptr = make_entry(value);
      return static_cast<Entry<T>*>(entry_ptr.get())->Value();
    }
  }